

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *p_v,void *p_min,void *p_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  undefined1 uVar1;
  undefined2 uVar2;
  bool bVar3;
  undefined2 *in_RCX;
  undefined4 in_EDX;
  double *in_R8;
  double *in_R9;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  float in_stack_00000044;
  bool r_1;
  ImU32 v32_1;
  float in_stack_0000004c;
  bool r;
  ImS32 v32;
  ImGuiSliderFlags in_stack_00000080;
  float in_stack_00000084;
  undefined4 in_stack_00000088;
  float in_stack_0000008c;
  ImGuiID in_stack_0000009c;
  ImGuiDataType in_stack_000000a8;
  ImGuiID in_stack_000000ac;
  ImRect *in_stack_000000b0;
  ImGuiSliderFlags in_stack_000000b8;
  ImRect *in_stack_000000c0;
  ImGuiSliderFlags in_stack_000000c8;
  ImRect *in_stack_000000d0;
  bool local_1;
  
  switch(in_EDX) {
  case 0:
    uVar1 = *(undefined1 *)in_RCX;
    local_1 = SliderBehaviorT<int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (int *)CONCAT44(power,v32),(int)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    if (local_1) {
      *(undefined1 *)in_RCX = uVar1;
    }
    break;
  case 1:
    uVar1 = *(undefined1 *)in_RCX;
    local_1 = SliderBehaviorT<unsigned_int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (uint *)CONCAT44(power,v32),(uint)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    if (local_1) {
      *(undefined1 *)in_RCX = uVar1;
    }
    break;
  case 2:
    uVar2 = *in_RCX;
    local_1 = SliderBehaviorT<int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (int *)CONCAT44(power,v32),(int)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    if (local_1) {
      *in_RCX = uVar2;
    }
    break;
  case 3:
    uVar2 = *in_RCX;
    local_1 = SliderBehaviorT<unsigned_int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (uint *)CONCAT44(power,v32),(uint)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    if (local_1) {
      *in_RCX = uVar2;
    }
    break;
  case 4:
    bVar3 = false;
    if (-0x40000001 < (int)*(float *)in_R8) {
      bVar3 = (int)*(float *)in_R9 < 0x40000000;
    }
    if (!bVar3) {
      __assert_fail("*(const ImS32*)p_min >= IM_S32_MIN/2 && *(const ImS32*)p_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa00,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (int *)CONCAT44(power,v32),(int)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    break;
  case 5:
    if (0x7fffffff < (uint)*(float *)in_R9) {
      __assert_fail("*(const ImU32*)p_max <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa03,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<unsigned_int,int,float>
                        ((ImRect *)p_min,(ImGuiID)p_max._4_4_,(ImGuiDataType)p_max._0_4_,
                         (uint *)CONCAT44(power,v32),(uint)in_stack_0000004c,v32_1,
                         (char *)CONCAT44(id,data_type),in_stack_00000044,(ImGuiSliderFlags)bb,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    break;
  case 6:
    bVar3 = false;
    if (-0x4000000000000001 < (long)*in_R8) {
      bVar3 = (long)*in_R9 < 0x4000000000000000;
    }
    if (!bVar3) {
      __assert_fail("*(const ImS64*)p_min >= IM_S64_MIN/2 && *(const ImS64*)p_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa06,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<long_long,long_long,double>
                        (out_grab_bb,in_stack_0000009c,flags,(longlong *)format,
                         CONCAT44(in_stack_0000008c,in_stack_00000088),
                         CONCAT44(in_stack_00000084,in_stack_00000080),(char *)in_stack_000000b0,
                         bb._4_4_,in_stack_000000b8,in_stack_000000c0);
    break;
  case 7:
    if (0x7fffffffffffffff < (ulong)*in_R9) {
      __assert_fail("*(const ImU64*)p_max <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa09,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,
                         (unsigned_long_long *)out_grab_bb,CONCAT44(in_stack_0000009c,flags),
                         (unsigned_long_long)format,(char *)in_stack_000000c0,in_stack_0000008c,
                         in_stack_000000c8,in_stack_000000d0);
    break;
  case 8:
    bVar3 = false;
    if (-1.7014117e+38 <= *(float *)in_R8) {
      bVar3 = *(float *)in_R9 <= 1.7014117e+38;
    }
    if (!bVar3) {
      __assert_fail("*(const float*)p_min >= -3.40282347e+38F/2.0f && *(const float*)p_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa0c,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<float,float,float>
                        ((ImRect *)CONCAT44(id,data_type),p_v._4_4_,(ImGuiDataType)p_v,
                         (float *)p_min,p_max._4_4_,p_max._0_4_,(char *)CONCAT44(power,v32),
                         in_stack_0000004c,v32_1,
                         (ImRect *)CONCAT44(in_stack_00000084,in_stack_00000080));
    break;
  case 9:
    bVar3 = false;
    if (-8.988465674311579e+307 <= *in_R8) {
      bVar3 = *in_R9 <= 8.988465674311579e+307;
    }
    if (!bVar3) {
      __assert_fail("*(const double*)p_min >= -1.7976931348623157e+308/2.0f && *(const double*)p_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0xa0f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    local_1 = SliderBehaviorT<double,double,double>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,(double *)out_grab_bb
                         ,(double)CONCAT44(in_stack_0000009c,flags),(double)format,
                         (char *)CONCAT44(in_stack_0000008c,in_stack_00000088),in_stack_00000084,
                         in_stack_00000080,in_stack_000000c0);
    break;
  case 10:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0xa13,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                 );
  }
  return local_1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* p_v, const void* p_min, const void* p_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)p_min,  *(const ImS8*)p_max,  format, power, flags, out_grab_bb); if (r) *(ImS8*)p_v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)p_min,  *(const ImU8*)p_max,  format, power, flags, out_grab_bb); if (r) *(ImU8*)p_v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)p_min, *(const ImS16*)p_max, format, power, flags, out_grab_bb); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)p_min, *(const ImU16*)p_max, format, power, flags, out_grab_bb); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)p_min >= IM_S32_MIN/2 && *(const ImS32*)p_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)p_v,  *(const ImS32*)p_min,  *(const ImS32*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)p_max <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)p_v,  *(const ImU32*)p_min,  *(const ImU32*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)p_min >= IM_S64_MIN/2 && *(const ImS64*)p_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)p_v,  *(const ImS64*)p_min,  *(const ImS64*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)p_max <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)p_v,  *(const ImU64*)p_min,  *(const ImU64*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)p_min >= -FLT_MAX/2.0f && *(const float*)p_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)p_v,  *(const float*)p_min,  *(const float*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)p_min >= -DBL_MAX/2.0f && *(const double*)p_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)p_v, *(const double*)p_min, *(const double*)p_max, format, power, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}